

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadAccessor(ColladaParser *this,string *pID)

{
  size_t *psVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  mapped_type *pmVar5;
  undefined4 extraout_var_00;
  long lVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t *psVar7;
  size_t sVar8;
  allocator local_1e1;
  size_t *local_1e0;
  size_t *local_1d8;
  size_t *local_1d0;
  string type;
  string name;
  
  uVar3 = GetAttribute(this,"source");
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
  if (*(char *)CONCAT44(extraout_var,iVar4) != '#') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    std::operator<<((ostream *)&name,"Unknown reference format in url \"");
    std::operator<<((ostream *)&name,(char *)CONCAT44(extraout_var,iVar4));
    std::operator<<((ostream *)&name,"\" in source attribute of <accessor> element.");
    std::__cxx11::stringbuf::str();
    ThrowException(this,&type);
  }
  uVar3 = GetAttribute(this,"count");
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar3);
  local_1d8 = (size_t *)CONCAT44(local_1d8._4_4_,iVar4);
  uVar3 = TestAttribute(this,"offset");
  if ((int)uVar3 < 0) {
    local_1e0 = (size_t *)0x0;
  }
  else {
    uVar3 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar3);
    local_1e0 = (size_t *)(ulong)uVar3;
  }
  uVar3 = TestAttribute(this,"stride");
  if ((int)uVar3 < 0) {
    sVar8 = 1;
  }
  else {
    uVar3 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar3);
    sVar8 = (size_t)uVar3;
  }
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  name.field_2._8_8_ = 0;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
           ::operator[](&this->mAccessorLibrary,pID);
  Collada::Accessor::operator=(pmVar5,(Accessor *)&name);
  Collada::Accessor::~Accessor((Accessor *)&name);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
           ::operator[](&this->mAccessorLibrary,pID);
  pmVar5->mCount = (ulong)local_1d8 & 0xffffffff;
  pmVar5->mOffset = (size_t)local_1e0;
  pmVar5->mStride = sVar8;
  std::__cxx11::string::assign((char *)&pmVar5->mSource);
  pmVar5->mSize = 0;
  local_1d8 = pmVar5->mSubOffset + 1;
  psVar1 = pmVar5->mSubOffset;
  local_1e0 = pmVar5->mSubOffset + 2;
  local_1d0 = pmVar5->mSubOffset + 3;
  while( true ) {
    while( true ) {
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar4 == '\0') {
        return;
      }
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar4 == 1) break;
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar4 == 2) {
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar4 = strcmp((char *)CONCAT44(extraout_var_01,iVar4),"accessor");
        if (iVar4 == 0) {
          return;
        }
        std::__cxx11::string::string
                  ((string *)&name,"Expected end of <accessor> element.",(allocator *)&type);
        ThrowException(this,&name);
      }
    }
    bVar2 = IsElement(this,"param");
    if (!bVar2) break;
    uVar3 = TestAttribute(this,"name");
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_allocated_capacity = name.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (-1 < (int)uVar3) {
      (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
      std::__cxx11::string::assign((char *)&name);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &name,"X");
      psVar7 = psVar1;
      if (((((bVar2) ||
            (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&name,"Y"), psVar7 = local_1d8, bVar2)) ||
           (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&name,"Z"), psVar7 = local_1e0, bVar2)) ||
          ((((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&name,"R"), psVar7 = psVar1, bVar2 ||
             (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&name,"G"), psVar7 = local_1d8, bVar2)) ||
            ((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&name,"B"), psVar7 = local_1e0, bVar2 ||
             ((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&name,"A"), psVar7 = local_1d0, bVar2 ||
              (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&name,"S"), psVar7 = psVar1, bVar2)))))) ||
           (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&name,"T"), psVar7 = local_1d8, bVar2)))) ||
         (((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&name,"P"), psVar7 = local_1e0, bVar2 ||
           (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&name,"U"), psVar7 = psVar1, bVar2)) ||
          (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&name,"V"), psVar7 = local_1d8, bVar2)))) {
        *psVar7 = (long)(pmVar5->mParams).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pmVar5->mParams).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5;
      }
    }
    uVar3 = TestAttribute(this,"type");
    if (-1 < (int)uVar3) {
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
      std::__cxx11::string::string
                ((string *)&type,(char *)CONCAT44(extraout_var_00,iVar4),&local_1e1);
      bVar2 = std::operator==(&type,"float4x4");
      lVar6 = 1;
      if (bVar2) {
        lVar6 = 0x10;
      }
      pmVar5->mSize = pmVar5->mSize + lVar6;
      std::__cxx11::string::~string((string *)&type);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pmVar5->mParams,(value_type *)&name);
    SkipElement(this);
    std::__cxx11::string::~string((string *)&name);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
  std::operator<<((ostream *)&name,"Unexpected sub element <");
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::operator<<((ostream *)&name,(char *)CONCAT44(extraout_var_02,iVar4));
  std::operator<<((ostream *)&name,"> in tag <accessor>");
  std::__cxx11::stringbuf::str();
  ThrowException(this,&type);
}

Assistant:

void ColladaParser::ReadAccessor(const std::string& pID)
{
    // read accessor attributes
    int attrSource = GetAttribute("source");
    const char* source = mReader->getAttributeValue(attrSource);
    if (source[0] != '#')
        ThrowException(format() << "Unknown reference format in url \"" << source << "\" in source attribute of <accessor> element.");
    int attrCount = GetAttribute("count");
    unsigned int count = (unsigned int)mReader->getAttributeValueAsInt(attrCount);
    int attrOffset = TestAttribute("offset");
    unsigned int offset = 0;
    if (attrOffset > -1)
        offset = (unsigned int)mReader->getAttributeValueAsInt(attrOffset);
    int attrStride = TestAttribute("stride");
    unsigned int stride = 1;
    if (attrStride > -1)
        stride = (unsigned int)mReader->getAttributeValueAsInt(attrStride);

    // store in the library under the given ID
    mAccessorLibrary[pID] = Accessor();
    Accessor& acc = mAccessorLibrary[pID];
    acc.mCount = count;
    acc.mOffset = offset;
    acc.mStride = stride;
    acc.mSource = source + 1; // ignore the leading '#'
    acc.mSize = 0; // gets incremented with every param

    // and read the components
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("param"))
            {
                // read data param
                int attrName = TestAttribute("name");
                std::string name;
                if (attrName > -1)
                {
                    name = mReader->getAttributeValue(attrName);

                    // analyse for common type components and store it's sub-offset in the corresponding field

                    /* Cartesian coordinates */
                    if (name == "X") acc.mSubOffset[0] = acc.mParams.size();
                    else if (name == "Y") acc.mSubOffset[1] = acc.mParams.size();
                    else if (name == "Z") acc.mSubOffset[2] = acc.mParams.size();

                    /* RGBA colors */
                    else if (name == "R") acc.mSubOffset[0] = acc.mParams.size();
                    else if (name == "G") acc.mSubOffset[1] = acc.mParams.size();
                    else if (name == "B") acc.mSubOffset[2] = acc.mParams.size();
                    else if (name == "A") acc.mSubOffset[3] = acc.mParams.size();

                    /* UVWQ (STPQ) texture coordinates */
                    else if (name == "S") acc.mSubOffset[0] = acc.mParams.size();
                    else if (name == "T") acc.mSubOffset[1] = acc.mParams.size();
                    else if (name == "P") acc.mSubOffset[2] = acc.mParams.size();
                    //  else if( name == "Q") acc.mSubOffset[3] = acc.mParams.size();
                        /* 4D uv coordinates are not supported in Assimp */

                        /* Generic extra data, interpreted as UV data, too*/
                    else if (name == "U") acc.mSubOffset[0] = acc.mParams.size();
                    else if (name == "V") acc.mSubOffset[1] = acc.mParams.size();
                    //else
                    //  DefaultLogger::get()->warn( format() << "Unknown accessor parameter \"" << name << "\". Ignoring data channel." );
                }

                // read data type
                int attrType = TestAttribute("type");
                if (attrType > -1)
                {
                    // for the moment we only distinguish between a 4x4 matrix and anything else.
                    // TODO: (thom) I don't have a spec here at work. Check if there are other multi-value types
                    // which should be tested for here.
                    std::string type = mReader->getAttributeValue(attrType);
                    if (type == "float4x4")
                        acc.mSize += 16;
                    else
                        acc.mSize += 1;
                }

                acc.mParams.push_back(name);

                // skip remaining stuff of this element, if any
                SkipElement();
            }
            else
            {
                ThrowException(format() << "Unexpected sub element <" << mReader->getNodeName() << "> in tag <accessor>");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "accessor") != 0)
                ThrowException("Expected end of <accessor> element.");
            break;
        }
    }
}